

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

void __thiscall cmCTestRunTest::ComputeWeightedCost(cmCTestRunTest *this)

{
  double dVar1;
  double current;
  double avgcost;
  double prev;
  cmCTestRunTest *this_local;
  
  dVar1 = (double)this->TestProperties->PreviousRuns;
  if ((this->TestResult).Status == 9) {
    this->TestProperties->Cost =
         (float)((dVar1 * (double)this->TestProperties->Cost + (this->TestResult).ExecutionTime) /
                (dVar1 + 1.0));
    this->TestProperties->PreviousRuns = this->TestProperties->PreviousRuns + 1;
  }
  return;
}

Assistant:

void cmCTestRunTest::ComputeWeightedCost()
{
  double prev = static_cast<double>(this->TestProperties->PreviousRuns);
  double avgcost = static_cast<double>(this->TestProperties->Cost);
  double current = this->TestResult.ExecutionTime;

  if(this->TestResult.Status == cmCTestTestHandler::COMPLETED)
    {
    this->TestProperties->Cost =
      static_cast<float>(((prev * avgcost) + current) / (prev + 1.0));
    this->TestProperties->PreviousRuns++;
    }
}